

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlParserInputPtr xmlNewInputStream(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  
  pxVar1 = (xmlParserInputPtr)(*xmlMalloc)(0x78);
  if (pxVar1 == (xmlParserInputPtr)0x0) {
    xmlCtxtErrMemory(ctxt);
    pxVar1 = (xmlParserInputPtr)0x0;
  }
  else {
    pxVar1->length = 0;
    pxVar1->line = 0;
    *(undefined8 *)&pxVar1->col = 0;
    pxVar1->flags = 0;
    pxVar1->id = 0;
    pxVar1->parentConsumed = 0;
    pxVar1->encoding = (xmlChar *)0x0;
    pxVar1->version = (xmlChar *)0x0;
    pxVar1->consumed = 0;
    pxVar1->free = (xmlParserInputDeallocate)0x0;
    pxVar1->cur = (xmlChar *)0x0;
    pxVar1->end = (xmlChar *)0x0;
    pxVar1->directory = (char *)0x0;
    pxVar1->base = (xmlChar *)0x0;
    pxVar1->buf = (xmlParserInputBufferPtr)0x0;
    pxVar1->filename = (char *)0x0;
    pxVar1->entity = (xmlEntityPtr)0x0;
    pxVar1->line = 1;
    pxVar1->col = 1;
  }
  return pxVar1;
}

Assistant:

xmlParserInputPtr
xmlNewInputStream(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr input;

    input = (xmlParserInputPtr) xmlMalloc(sizeof(xmlParserInput));
    if (input == NULL) {
        xmlCtxtErrMemory(ctxt);
	return(NULL);
    }
    memset(input, 0, sizeof(xmlParserInput));
    input->line = 1;
    input->col = 1;

    return(input);
}